

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O1

RPCHelpMan * wallet::gettransaction(void)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong *puVar3;
  long *plVar4;
  string name;
  string name_00;
  string name_01;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string name_02;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_18;
  string description_19;
  string description_20;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  long *plVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  long lVar15;
  RPCResult *arg_1;
  pointer __args;
  undefined8 uVar16;
  RPCHelpMan *in_RDI;
  RPCResult *arg;
  pointer pRVar17;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  undefined4 in_stack_ffffffffffffe568;
  undefined4 uVar18;
  undefined4 in_stack_ffffffffffffe56c;
  undefined8 in_stack_ffffffffffffe570;
  undefined8 in_stack_ffffffffffffe580;
  RPCResult *pRVar19;
  undefined8 in_stack_ffffffffffffe588;
  undefined8 in_stack_ffffffffffffe590;
  undefined8 in_stack_ffffffffffffe598;
  code *pcVar20;
  undefined8 in_stack_ffffffffffffe5a0;
  undefined1 in_stack_ffffffffffffe5a8 [16];
  pointer in_stack_ffffffffffffe5b8;
  pointer pRVar21;
  pointer in_stack_ffffffffffffe5c0;
  pointer in_stack_ffffffffffffe5c8;
  pointer pRVar22;
  pointer in_stack_ffffffffffffe5d0;
  undefined1 in_stack_ffffffffffffe5d8 [16];
  pointer in_stack_ffffffffffffe5e8;
  pointer pRVar23;
  pointer in_stack_ffffffffffffe5f0;
  pointer pRVar24;
  pointer in_stack_ffffffffffffe5f8;
  undefined8 in_stack_ffffffffffffe600;
  pointer in_stack_ffffffffffffe608;
  pointer in_stack_ffffffffffffe610;
  pointer in_stack_ffffffffffffe618;
  _Vector_impl_data in_stack_ffffffffffffe620;
  pointer in_stack_ffffffffffffe638;
  pointer in_stack_ffffffffffffe640;
  pointer in_stack_ffffffffffffe648;
  vector<RPCResult,_std::allocator<RPCResult>_> local_19a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1988;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1968;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1948;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1928;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1908;
  vector<RPCResult,_std::allocator<RPCResult>_> local_18e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_18d0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_18b8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_18a0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1888;
  allocator_type local_1869;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1868;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1848;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1828;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1808;
  vector<RPCResult,_std::allocator<RPCResult>_> local_17e8;
  RPCResults local_17d0;
  allocator_type local_17b2;
  bool local_17b1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_17b0;
  string local_1798;
  string local_1778;
  string local_1758;
  string local_1738;
  string local_1718;
  string local_16f8;
  string local_16d8;
  string local_16b8;
  string local_1698;
  string local_1678;
  string local_1658;
  string local_1638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15f8;
  ulong *local_15d8;
  undefined8 local_15d0;
  ulong local_15c8;
  undefined8 uStack_15c0;
  ulong *local_15b8;
  size_type local_15b0;
  ulong local_15a8;
  undefined8 uStack_15a0;
  long *local_1598 [2];
  long local_1588 [2];
  long *local_1578 [2];
  long local_1568 [2];
  RPCResult local_1558;
  long *local_14d0 [2];
  long local_14c0 [2];
  long *local_14b0 [2];
  long local_14a0 [2];
  long *local_1490 [2];
  long local_1480 [2];
  long *local_1470 [2];
  long local_1460 [2];
  long *local_1450 [2];
  long local_1440 [2];
  long *local_1430 [2];
  long local_1420 [2];
  RPCResult local_1410;
  long *local_1388 [2];
  long local_1378 [2];
  long *local_1368 [2];
  long local_1358 [2];
  long *local_1348 [2];
  long local_1338 [2];
  long *local_1328 [2];
  long local_1318 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1308;
  size_type *local_12e8;
  size_type local_12e0;
  size_type local_12d8;
  undefined8 uStack_12d0;
  long *local_12c8 [2];
  long local_12b8 [2];
  long *local_12a8 [2];
  long local_1298 [2];
  long *local_1288 [2];
  long local_1278 [2];
  long *local_1268 [2];
  long local_1258 [2];
  long *local_1248 [2];
  long local_1238 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1228;
  long *local_1208 [2];
  long local_11f8 [2];
  long *local_11e8 [2];
  long local_11d8 [2];
  long *local_11c8 [2];
  long local_11b8 [2];
  long *local_11a8 [2];
  long local_1198 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1188;
  long *local_1168 [2];
  long local_1158 [2];
  pointer local_1148 [2];
  undefined1 local_1138 [152];
  RPCResult local_10a0;
  RPCResult local_1018;
  RPCResult local_f90;
  RPCResult local_f08;
  RPCResult local_e80;
  RPCResult local_df8;
  RPCResult local_d70;
  RPCResult local_ce8;
  long *local_c60 [2];
  long local_c50 [2];
  long *local_c40 [2];
  long local_c30 [2];
  undefined1 local_c20 [120];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ba8;
  long *local_b98 [2];
  long local_b88 [2];
  long *local_b78 [2];
  long local_b68 [2];
  RPCResult local_b58;
  RPCResult local_ad0;
  RPCResult local_a48;
  RPCResult local_9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  size_type *local_918;
  size_type local_910;
  size_type local_908 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  pointer local_8b8 [2];
  undefined1 local_8a8 [152];
  RPCResult local_810;
  long *local_788 [2];
  long local_778 [2];
  long *local_768 [2];
  long local_758 [2];
  RPCResult local_748;
  undefined1 local_6c0;
  undefined1 *local_6b8;
  undefined8 local_6b0;
  undefined1 local_6a8;
  undefined7 uStack_6a7;
  undefined1 local_698 [32];
  long *local_678 [2];
  long local_668 [2];
  UniValue local_658;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_600;
  undefined1 local_5a8;
  long *local_5a0 [2];
  long local_590 [2];
  undefined1 local_580;
  undefined1 *local_578;
  undefined8 local_570;
  undefined1 local_568;
  undefined7 uStack_567;
  undefined1 local_558 [32];
  long *local_538 [2];
  long local_528 [2];
  uint *local_518;
  undefined8 local_510;
  uint local_508;
  undefined4 uStack_504;
  undefined4 uStack_500;
  undefined4 uStack_4fc;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4f8;
  undefined1 local_4a0;
  long *local_498 [2];
  long local_488 [2];
  undefined1 local_478;
  vector<RPCArg,_std::allocator<RPCArg>_> local_470;
  undefined1 auStack_458 [8];
  undefined1 local_450 [32];
  long *local_430 [2];
  long local_420 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  undefined1 local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  RPCArg local_390;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_10a0.m_cond._M_string_length = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"gettransaction","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"\nGet detailed information about in-wallet transaction <txid>\n",""
            );
  local_3b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_3b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"txid","");
  local_410._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_3b8 = 0;
  local_430[0] = local_420;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"The transaction id","");
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_478 = 0;
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_450._0_8_ = (pointer)0x0;
  local_450._8_2_ = 0;
  local_450._10_6_ = 0;
  local_450._16_2_ = 0;
  local_450._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe56c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe568;
  name._M_string_length = in_stack_ffffffffffffe570;
  name.field_2._M_allocated_capacity = (size_type)in_RDI;
  name.field_2._8_8_ = in_stack_ffffffffffffe580;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe590;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe588;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe598;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe5a0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe5a8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe5b8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe5c0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe5c8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe5d0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe5d8;
  description_18._M_string_length = (size_type)in_stack_ffffffffffffe5f0;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5e8;
  description_18.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe5f8;
  description_18.field_2._8_8_ = in_stack_ffffffffffffe600;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe610;
  opts._0_8_ = in_stack_ffffffffffffe608;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe618;
  opts._24_24_ = in_stack_ffffffffffffe620;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe638;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe640;
  opts._64_8_ = in_stack_ffffffffffffe648;
  ::RPCArg::RPCArg(&local_390,name,(Type)&local_3b0,fallback,description_18,opts);
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"include_watchonly","");
  local_518 = &local_508;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_518,"true for watch-only wallets, otherwise false","");
  local_4f8._0_8_ = (long)&local_4f8 + 0x10;
  if (local_518 == &local_508) {
    local_4f8._24_4_ = uStack_500;
    local_4f8._28_4_ = uStack_4fc;
  }
  else {
    local_4f8._0_8_ = local_518;
  }
  local_4f8._8_8_ = local_510;
  local_510 = 0;
  local_508 = local_508 & 0xffffff00;
  local_4a0 = 1;
  local_538[0] = local_528;
  local_518 = &local_508;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_538,
             "Whether to include watch-only addresses in balance calculation and details[]","");
  local_578 = &local_568;
  local_580 = 0;
  local_570 = 0;
  local_568 = 0;
  local_558._0_8_ = (pointer)0x0;
  local_558._8_2_ = 0;
  local_558._10_6_ = 0;
  local_558._16_2_ = 0;
  local_558._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe56c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe568;
  name_00._M_string_length = in_stack_ffffffffffffe570;
  name_00.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_00.field_2._8_8_ = in_stack_ffffffffffffe580;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe590;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe588;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe598;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe5a0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe5a8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe5b8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe5c0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe5c8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe5d0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe5d8;
  description_19._M_string_length = (size_type)in_stack_ffffffffffffe5f0;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5e8;
  description_19.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe5f8;
  description_19.field_2._8_8_ = in_stack_ffffffffffffe600;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe610;
  opts_00._0_8_ = in_stack_ffffffffffffe608;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe618;
  opts_00._24_24_ = in_stack_ffffffffffffe620;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe638;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe640;
  opts_00._64_8_ = in_stack_ffffffffffffe648;
  ::RPCArg::RPCArg(&local_288,name_00,(Type)local_498,fallback_00,description_19,opts_00);
  local_5a0[0] = local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"verbose","");
  local_17b1 = false;
  ::UniValue::UniValue<bool,_bool,_true>(&local_658,&local_17b1);
  paVar14 = &local_658.val.field_2;
  local_600._8_8_ = (long)&local_600 + 0x18;
  local_600._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_658.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.val._M_dataplus._M_p == paVar14) {
    local_600._32_8_ = local_658.val.field_2._8_8_;
  }
  else {
    local_600._8_8_ = local_658.val._M_dataplus._M_p;
  }
  local_600._16_8_ = local_658.val._M_string_length;
  local_658.val._M_string_length = 0;
  local_658.val.field_2._M_local_buf[0] = '\0';
  local_600._40_8_ =
       local_658.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_600._48_8_ =
       local_658.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_600._56_8_ =
       local_658.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_658.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_658.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_658.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_600._64_4_ =
       local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_600._68_4_ =
       local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_600._72_4_ =
       local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_600._76_4_ =
       local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_600._80_8_ =
       local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5a8 = 2;
  local_678[0] = local_668;
  local_658.val._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_678,
             "Whether to include a `decoded` field containing the decoded transaction (equivalent to RPC decoderawtransaction)"
             ,"");
  local_6b8 = &local_6a8;
  local_6c0 = 0;
  local_6b0 = 0;
  local_6a8 = 0;
  local_698._0_8_ = (pointer)0x0;
  local_698._8_2_ = 0;
  local_698._10_6_ = 0;
  local_698._16_2_ = 0;
  local_698._18_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe56c;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe568;
  name_01._M_string_length = in_stack_ffffffffffffe570;
  name_01.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_01.field_2._8_8_ = in_stack_ffffffffffffe580;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe590;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe588;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe598;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe5a0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe5a8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe5b8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe5c0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe5c8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe5d0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe5d8;
  description_20._M_string_length = (size_type)in_stack_ffffffffffffe5f0;
  description_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5e8;
  description_20.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe5f8;
  description_20.field_2._8_8_ = in_stack_ffffffffffffe600;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe610;
  opts_01._0_8_ = in_stack_ffffffffffffe608;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe618;
  opts_01._24_24_ = in_stack_ffffffffffffe620;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe638;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe640;
  opts_01._64_8_ = in_stack_ffffffffffffe648;
  ::RPCArg::RPCArg(&local_180,name_01,(Type)local_5a0,fallback_01,description_20,opts_01);
  __l._M_len = 3;
  __l._M_array = &local_390;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_17b0,__l,&local_17b2);
  local_768[0] = local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_768,"");
  local_788[0] = local_778;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"");
  local_8b8[0] = (pointer)local_8a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8b8,"amount","");
  std::operator+(&local_8d8,"The amount in ",&::CURRENCY_UNIT_abi_cxx11_);
  local_1848.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1848.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1848.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe56c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe568;
  m_key_name._M_string_length = in_stack_ffffffffffffe570;
  m_key_name.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffe580;
  description._M_string_length = in_stack_ffffffffffffe590;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe5b8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_8a8 + 0x10),STR_AMOUNT,m_key_name,description,inner,
             SUB81(local_8b8,0));
  local_8f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_8f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f8,"fee","");
  std::operator+(&local_938,"The amount of the fee in ",&::CURRENCY_UNIT_abi_cxx11_);
  pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_938,
                       ". This is negative and only available for the\n\'send\' category of transactions."
                      );
  local_918 = local_908;
  psVar1 = (size_type *)(pbVar12->_M_dataplus)._M_p;
  paVar14 = &pbVar12->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar14) {
    local_908[0] = paVar14->_M_allocated_capacity;
    local_908[1] = *(undefined8 *)((long)&pbVar12->field_2 + 8);
  }
  else {
    local_908[0] = paVar14->_M_allocated_capacity;
    local_918 = psVar1;
  }
  local_910 = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar12->_M_string_length = 0;
  (pbVar12->field_2)._M_local_buf[0] = '\0';
  local_1868.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1868.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1868.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar5._4_8_ = in_stack_ffffffffffffe570;
  auVar5._0_4_ = in_stack_ffffffffffffe56c;
  auVar5._12_8_ = in_RDI;
  auVar5._20_8_ = in_stack_ffffffffffffe580;
  auVar5._28_4_ = 0;
  description_00._M_string_length = in_stack_ffffffffffffe590;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_00.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5b8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult
            (&local_810,STR_AMOUNT,(string)(auVar5 << 0x20),SUB81(&local_8f8,0),description_00,
             inner_00,true);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)(local_8a8 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1828,__l_00,&local_1869);
  TransactionDescriptionString();
  std::vector<RPCResult,_std::allocator<RPCResult>_>::reserve
            (&local_1828,
             ((long)local_1888.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1888.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f +
             ((long)local_1828.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1828.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f);
  if (local_1888.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1888.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar17 = local_1888.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      std::vector<RPCResult,_std::allocator<RPCResult>_>::emplace_back<RPCResult>
                (&local_1828,pRVar17);
      pRVar17 = pRVar17 + 1;
    } while (pRVar17 !=
             local_1888.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_1808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1828.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1828.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1828.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1828.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1828.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1828.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b78[0] = local_b68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b78,"details","");
  local_b98[0] = local_b88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b98,"");
  local_c40[0] = local_c30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c40,"");
  local_c60[0] = local_c50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c60,"");
  local_1148[0] = (pointer)local_1138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1148,"involvesWatchonly","");
  local_1168[0] = local_1158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1168,
             "Only returns true if imported addresses were involved in transaction.","");
  local_18e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_18e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar6._4_8_ = in_stack_ffffffffffffe570;
  auVar6._0_4_ = in_stack_ffffffffffffe56c;
  auVar6._12_8_ = in_RDI;
  auVar6._20_8_ = in_stack_ffffffffffffe580;
  auVar6._28_4_ = 0;
  description_01._M_string_length = in_stack_ffffffffffffe590;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_01.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5b8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_1138 + 0x10),BOOL,(string)(auVar6 << 0x20),SUB81(local_1148,0),
             description_01,inner_01,true);
  pRVar19 = &local_10a0;
  local_1188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1188,"address","");
  local_11a8[0] = local_1198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11a8,"The bitcoin address involved in the transaction.","");
  local_1908.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1908.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1908.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar18 = 0;
  auVar7._4_8_ = in_stack_ffffffffffffe570;
  auVar7._0_4_ = in_stack_ffffffffffffe56c;
  auVar7._12_8_ = in_RDI;
  auVar7._20_8_ = pRVar19;
  auVar7._28_4_ = 0;
  description_02._M_string_length = in_stack_ffffffffffffe590;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_02.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5b8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult
            (&local_10a0,STR,(string)(auVar7 << 0x20),SUB81(&local_1188,0),description_02,inner_02,
             true);
  pRVar19 = &local_1018;
  local_11c8[0] = local_11b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11c8,"category","");
  local_11e8[0] = local_11d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11e8,
             "The transaction category.\n\"send\"                  Transactions sent.\n\"receive\"               Non-coinbase transactions received.\n\"generate\"              Coinbase transactions received with more than 100 confirmations.\n\"immature\"              Coinbase transactions received with 100 or fewer confirmations.\n\"orphan\"                Orphaned coinbase transactions received."
             ,"");
  local_1928.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1928.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1928.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe56c;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_00._M_string_length = in_stack_ffffffffffffe570;
  m_key_name_00.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_00.field_2._8_8_ = pRVar19;
  description_03._M_string_length = in_stack_ffffffffffffe590;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_03.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5b8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult(&local_1018,STR,m_key_name_00,description_03,inner_03,SUB81(local_11c8,0));
  pRVar19 = &local_f90;
  local_1208[0] = local_11f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1208,"amount","");
  std::operator+(&local_1228,"The amount in ",&::CURRENCY_UNIT_abi_cxx11_);
  local_1948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe56c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_01._M_string_length = in_stack_ffffffffffffe570;
  m_key_name_01.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_01.field_2._8_8_ = pRVar19;
  description_04._M_string_length = in_stack_ffffffffffffe590;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_04.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5b8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult
            (&local_f90,STR_AMOUNT,m_key_name_01,description_04,inner_04,SUB81(local_1208,0));
  pRVar19 = &local_f08;
  local_1248[0] = local_1238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1248,"label","");
  local_1268[0] = local_1258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1268,"A comment for the address/transaction, if any","");
  local_1968.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1968.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1968.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar18 = 0;
  auVar8._4_8_ = in_stack_ffffffffffffe570;
  auVar8._0_4_ = in_stack_ffffffffffffe56c;
  auVar8._12_8_ = in_RDI;
  auVar8._20_8_ = pRVar19;
  auVar8._28_4_ = 0;
  description_05._M_string_length = in_stack_ffffffffffffe590;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_05.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5b8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult
            (&local_f08,STR,(string)(auVar8 << 0x20),SUB81(local_1248,0),description_05,inner_05,
             true);
  pRVar19 = &local_e80;
  local_1288[0] = local_1278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1288,"vout","");
  local_12a8[0] = local_1298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_12a8,"the vout value","");
  local_1988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe56c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_02._M_string_length = in_stack_ffffffffffffe570;
  m_key_name_02.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_02.field_2._8_8_ = pRVar19;
  description_06._M_string_length = in_stack_ffffffffffffe590;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_06.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_06.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5b8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult(&local_e80,NUM,m_key_name_02,description_06,inner_06,SUB81(local_1288,0));
  pRVar19 = &local_df8;
  local_12c8[0] = local_12b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_12c8,"fee","");
  std::operator+(&local_1308,"The amount of the fee in ",&::CURRENCY_UNIT_abi_cxx11_);
  pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_1308,
                       ". This is negative and only available for the \n\'send\' category of transactions."
                      );
  local_12e8 = &local_12d8;
  psVar1 = (size_type *)(pbVar12->_M_dataplus)._M_p;
  paVar14 = &pbVar12->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar14) {
    local_12d8 = paVar14->_M_allocated_capacity;
    uStack_12d0 = *(undefined8 *)((long)&pbVar12->field_2 + 8);
  }
  else {
    local_12d8 = paVar14->_M_allocated_capacity;
    local_12e8 = psVar1;
  }
  local_12e0 = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar12->_M_string_length = 0;
  (pbVar12->field_2)._M_local_buf[0] = '\0';
  local_19a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_19a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_19a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar18 = 0;
  auVar9._4_8_ = in_stack_ffffffffffffe570;
  auVar9._0_4_ = in_stack_ffffffffffffe56c;
  auVar9._12_8_ = in_RDI;
  auVar9._20_8_ = pRVar19;
  auVar9._28_4_ = 0;
  description_07._M_string_length = in_stack_ffffffffffffe590;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_07.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_07.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5b8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult
            (&local_df8,STR_AMOUNT,(string)(auVar9 << 0x20),SUB81(local_12c8,0),description_07,
             inner_07,true);
  pRVar19 = &local_d70;
  local_1328[0] = local_1318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1328,"abandoned","");
  local_1348[0] = local_1338;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1348,
             "\'true\' if the transaction has been abandoned (inputs are respendable).","");
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe56c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_03._M_string_length = in_stack_ffffffffffffe570;
  m_key_name_03.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_03.field_2._8_8_ = pRVar19;
  description_08._M_string_length = in_stack_ffffffffffffe590;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_08.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_08.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5b8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult(&local_d70,BOOL,m_key_name_03,description_08,inner_08,SUB81(local_1328,0));
  pRVar19 = &local_ce8;
  local_1368[0] = local_1358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1368,"parent_descs","");
  local_1388[0] = local_1378;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1388,
             "Only if \'category\' is \'received\'. List of parent descriptors for the output script of this coin."
             ,"");
  local_1430[0] = local_1420;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1430,"desc","");
  local_1450[0] = local_1440;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1450,"The descriptor string.","");
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe56c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_04._M_string_length = in_stack_ffffffffffffe570;
  m_key_name_04.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_04.field_2._8_8_ = pRVar19;
  description_09._M_string_length = in_stack_ffffffffffffe590;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_09.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_09.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5b8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult(&local_1410,STR,m_key_name_04,description_09,inner_09,SUB81(local_1430,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_1410;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe620,__l_01,
             (allocator_type *)&stack0xffffffffffffe607);
  uVar18 = 0;
  auVar10._4_8_ = in_stack_ffffffffffffe570;
  auVar10._0_4_ = in_stack_ffffffffffffe56c;
  auVar10._12_8_ = in_RDI;
  auVar10._20_8_ = pRVar19;
  auVar10._28_4_ = 0;
  description_10._M_string_length = in_stack_ffffffffffffe590;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_10.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_10.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5b8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult
            (&local_ce8,ARR,(string)(auVar10 << 0x20),SUB81(local_1368,0),description_10,inner_10,
             true);
  __l_02._M_len = 9;
  __l_02._M_array = (iterator)(local_1138 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_18d0,__l_02,(allocator_type *)&stack0xffffffffffffe606);
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe56c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_05._M_string_length = in_stack_ffffffffffffe570;
  m_key_name_05.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_05.field_2._8_8_ = pRVar19;
  description_11._M_string_length = in_stack_ffffffffffffe590;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_11.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_11.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5b8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult
            ((RPCResult *)local_c20,OBJ,m_key_name_05,description_11,inner_11,SUB81(local_c40,0));
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)local_c20;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_18b8,__l_03,(allocator_type *)&stack0xffffffffffffe605);
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe56c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_06._M_string_length = in_stack_ffffffffffffe570;
  m_key_name_06.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_06.field_2._8_8_ = pRVar19;
  description_12._M_string_length = in_stack_ffffffffffffe590;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_12.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_12.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5b8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult(&local_b58,ARR,m_key_name_06,description_12,inner_12,SUB81(local_b78,0));
  local_1470[0] = local_1460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1470,"hex","");
  local_1490[0] = local_1480;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1490,"Raw data for transaction","");
  pRVar23 = (pointer)0x0;
  pRVar24 = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe56c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_07._M_string_length = in_stack_ffffffffffffe570;
  m_key_name_07.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_07.field_2._8_8_ = pRVar19;
  description_13._M_string_length = in_stack_ffffffffffffe590;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_13.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_13.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5b8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult
            (&local_ad0,STR_HEX,m_key_name_07,description_13,inner_13,SUB81(local_1470,0));
  local_14b0[0] = local_14a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14b0,"decoded","");
  local_14d0[0] = local_14c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14d0,"The decoded transaction (only present when `verbose` is passed)",
             "");
  local_1578[0] = local_1568;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1578,"");
  local_1598[0] = local_1588;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1598,
             "Equivalent to the RPC decoderawtransaction method, or the RPC getrawtransaction method when `verbose` is passed."
             ,"");
  pRVar21 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  pRVar22 = (pointer)0x0;
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe56c;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_08._M_string_length = in_stack_ffffffffffffe570;
  m_key_name_08.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_08.field_2._8_8_ = pRVar19;
  description_14._M_string_length = in_stack_ffffffffffffe590;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_14.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_14.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult
            (&local_1558,ELISION,m_key_name_08,description_14,inner_14,SUB81(local_1578,0));
  __l_04._M_len = 1;
  __l_04._M_array = &local_1558;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe5d0,__l_04,
             (allocator_type *)&stack0xffffffffffffe5b7);
  uVar18 = 0;
  auVar11._4_8_ = in_stack_ffffffffffffe570;
  auVar11._0_4_ = in_stack_ffffffffffffe56c;
  auVar11._12_8_ = in_RDI;
  auVar11._20_8_ = pRVar19;
  auVar11._28_4_ = 0;
  description_15._M_string_length = in_stack_ffffffffffffe590;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_15.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_15.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar21;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult
            (&local_a48,OBJ,(string)(auVar11 << 0x20),SUB81(local_14b0,0),description_15,inner_15,
             true);
  ::RPCResult::RPCResult(&local_9c0,(RPCResult *)RESULT_LAST_PROCESSED_BLOCK);
  __l_05._M_len = 4;
  __l_05._M_array = &local_b58;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_18a0,__l_05,(allocator_type *)&stack0xffffffffffffe5b6);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::reserve
            (&local_1808,
             ((long)local_18a0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_18a0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f +
             ((long)local_1808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f);
  if (local_18a0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_18a0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __args = local_18a0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      std::vector<RPCResult,_std::allocator<RPCResult>_>::emplace_back<RPCResult>
                (&local_1808,__args);
      __args = __args + 1;
    } while (__args != local_18a0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  local_17e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_17e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_17e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1808.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe56c;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar18;
  m_key_name_09._M_string_length = in_stack_ffffffffffffe570;
  m_key_name_09.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_09.field_2._8_8_ = pRVar19;
  description_16._M_string_length = in_stack_ffffffffffffe590;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe588;
  description_16.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  description_16.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar21;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  ::RPCResult::RPCResult(&local_748,OBJ,m_key_name_09,description_16,inner_16,SUB81(local_768,0));
  result._4_4_ = in_stack_ffffffffffffe56c;
  result.m_type = uVar18;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe570;
  result.m_key_name._M_string_length = (size_type)in_RDI;
  result.m_key_name.field_2._M_allocated_capacity = (size_type)pRVar19;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffe588;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe590;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe598;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe5a0;
  result.m_optional = (bool)in_stack_ffffffffffffe5a8[0];
  result.m_skip_type_check = (bool)in_stack_ffffffffffffe5a8[1];
  result._66_6_ = in_stack_ffffffffffffe5a8._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  result.m_description._M_string_length = (size_type)pRVar21;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar17;
  result.m_description.field_2._8_8_ = pRVar22;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5d0;
  result.m_cond._8_16_ = in_stack_ffffffffffffe5d8;
  result.m_cond.field_2._8_8_ = pRVar23;
  RPCResults::RPCResults(&local_17d0,result);
  local_1658._M_dataplus._M_p = (pointer)&local_1658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1658,"gettransaction","");
  local_1678._M_dataplus._M_p = (pointer)&local_1678.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1678,
             "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\"","");
  HelpExampleCli(&local_1638,&local_1658,&local_1678);
  local_16b8._M_dataplus._M_p = (pointer)&local_16b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_16b8,"gettransaction","");
  local_16d8._M_dataplus._M_p = (pointer)&local_16d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_16d8,
             "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\" true","");
  HelpExampleCli(&local_1698,&local_16b8,&local_16d8);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1638._M_dataplus._M_p != &local_1638.field_2) {
    uVar16 = local_1638.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_1698._M_string_length + local_1638._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1698._M_dataplus._M_p != &local_1698.field_2) {
      uVar16 = local_1698.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_1698._M_string_length + local_1638._M_string_length)
    goto LAB_00cf9315;
    pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_1698,0,0,local_1638._M_dataplus._M_p,local_1638._M_string_length);
  }
  else {
LAB_00cf9315:
    pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_1638,local_1698._M_dataplus._M_p,local_1698._M_string_length);
  }
  local_1618._M_dataplus._M_p = (pointer)&local_1618.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar12->_M_dataplus)._M_p;
  paVar14 = &pbVar12->field_2;
  if (paVar2 == paVar14) {
    local_1618.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_1618.field_2._8_4_ = *(undefined4 *)((long)&pbVar12->field_2 + 8);
    local_1618.field_2._12_4_ = *(undefined4 *)((long)&pbVar12->field_2 + 0xc);
  }
  else {
    local_1618.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_1618._M_dataplus._M_p = (pointer)paVar2;
  }
  local_1618._M_string_length = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar12->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  local_1718._M_dataplus._M_p = (pointer)&local_1718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1718,"gettransaction","");
  local_1738._M_dataplus._M_p = (pointer)&local_1738.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1738,
             "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\" false true","");
  HelpExampleCli(&local_16f8,&local_1718,&local_1738);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1618._M_dataplus._M_p != &local_1618.field_2) {
    uVar16 = local_1618.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_16f8._M_string_length + local_1618._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16f8._M_dataplus._M_p != &local_16f8.field_2) {
      uVar16 = local_16f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_16f8._M_string_length + local_1618._M_string_length)
    goto LAB_00cf944e;
    pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_16f8,0,0,local_1618._M_dataplus._M_p,local_1618._M_string_length);
  }
  else {
LAB_00cf944e:
    pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_1618,local_16f8._M_dataplus._M_p,local_16f8._M_string_length);
  }
  local_15f8._M_dataplus._M_p = (pointer)&local_15f8.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar12->_M_dataplus)._M_p;
  paVar14 = &pbVar12->field_2;
  if (paVar2 == paVar14) {
    local_15f8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_15f8.field_2._8_4_ = *(undefined4 *)((long)&pbVar12->field_2 + 8);
    local_15f8.field_2._12_4_ = *(undefined4 *)((long)&pbVar12->field_2 + 0xc);
  }
  else {
    local_15f8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_15f8._M_dataplus._M_p = (pointer)paVar2;
  }
  local_15f8._M_string_length = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar12->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  local_1778._M_dataplus._M_p = (pointer)&local_1778.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1778,"gettransaction","");
  local_1798._M_dataplus._M_p = (pointer)&local_1798.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1798,
             "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\"","");
  HelpExampleRpc(&local_1758,&local_1778,&local_1798);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15f8._M_dataplus._M_p != &local_15f8.field_2) {
    uVar16 = local_15f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_1758._M_string_length + local_15f8._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1758._M_dataplus._M_p != &local_1758.field_2) {
      uVar16 = local_1758.field_2._M_allocated_capacity;
    }
    if (local_1758._M_string_length + local_15f8._M_string_length <= (ulong)uVar16) {
      pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&local_1758,0,0,local_15f8._M_dataplus._M_p,local_15f8._M_string_length);
      goto LAB_00cf95b1;
    }
  }
  pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_15f8,local_1758._M_dataplus._M_p,local_1758._M_string_length);
LAB_00cf95b1:
  local_15d8 = &local_15c8;
  puVar3 = (ulong *)(pbVar12->_M_dataplus)._M_p;
  paVar14 = &pbVar12->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3 == paVar14) {
    local_15c8 = paVar14->_M_allocated_capacity;
    uStack_15c0 = *(undefined8 *)((long)&pbVar12->field_2 + 8);
  }
  else {
    local_15c8 = paVar14->_M_allocated_capacity;
    local_15d8 = puVar3;
  }
  local_15b0 = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar12->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  if (local_15d8 == &local_15c8) {
    uStack_15a0 = uStack_15c0;
    local_15b8 = &local_15a8;
  }
  else {
    local_15b8 = local_15d8;
  }
  local_15a8 = local_15c8;
  local_15d0 = 0;
  local_15c8 = local_15c8 & 0xffffffffffffff00;
  pcVar20 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/transactions.cpp:751:9)>
            ::_M_manager;
  name_02._M_string_length = in_stack_ffffffffffffe570;
  name_02._M_dataplus._M_p = &stack0xffffffffffffe588;
  name_02.field_2._M_allocated_capacity = (size_type)in_RDI;
  name_02.field_2._8_8_ = pRVar19;
  description_17.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/transactions.cpp:751:9)>
       ::_M_manager;
  description_17._M_dataplus._M_p = (pointer)0x0;
  description_17._M_string_length = 0;
  description_17.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/transactions.cpp:751:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar21;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffe5a8._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffe5a8._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar22;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar17;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe5d0;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar23;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5d8._0_8_;
  examples.m_examples._M_string_length = in_stack_ffffffffffffe5d8._8_8_;
  examples.m_examples.field_2._8_8_ = pRVar24;
  local_15d8 = &local_15c8;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_02,description_17,args,results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar20 != (code *)0x0) {
    (*pcVar20)(&stack0xffffffffffffe588,&stack0xffffffffffffe588,3);
  }
  if (local_15b8 != &local_15a8) {
    operator_delete(local_15b8,local_15a8 + 1);
  }
  if (local_15d8 != &local_15c8) {
    operator_delete(local_15d8,local_15c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1758._M_dataplus._M_p != &local_1758.field_2) {
    operator_delete(local_1758._M_dataplus._M_p,local_1758.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1798._M_dataplus._M_p != &local_1798.field_2) {
    operator_delete(local_1798._M_dataplus._M_p,local_1798.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1778._M_dataplus._M_p != &local_1778.field_2) {
    operator_delete(local_1778._M_dataplus._M_p,local_1778.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15f8._M_dataplus._M_p != &local_15f8.field_2) {
    operator_delete(local_15f8._M_dataplus._M_p,local_15f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16f8._M_dataplus._M_p != &local_16f8.field_2) {
    operator_delete(local_16f8._M_dataplus._M_p,local_16f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1738._M_dataplus._M_p != &local_1738.field_2) {
    operator_delete(local_1738._M_dataplus._M_p,local_1738.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1718._M_dataplus._M_p != &local_1718.field_2) {
    operator_delete(local_1718._M_dataplus._M_p,local_1718.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1618._M_dataplus._M_p != &local_1618.field_2) {
    operator_delete(local_1618._M_dataplus._M_p,local_1618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1698._M_dataplus._M_p != &local_1698.field_2) {
    operator_delete(local_1698._M_dataplus._M_p,local_1698.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16d8._M_dataplus._M_p != &local_16d8.field_2) {
    operator_delete(local_16d8._M_dataplus._M_p,local_16d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16b8._M_dataplus._M_p != &local_16b8.field_2) {
    operator_delete(local_16b8._M_dataplus._M_p,local_16b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1638._M_dataplus._M_p != &local_1638.field_2) {
    operator_delete(local_1638._M_dataplus._M_p,local_1638.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1678._M_dataplus._M_p != &local_1678.field_2) {
    operator_delete(local_1678._M_dataplus._M_p,local_1678.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1658._M_dataplus._M_p != &local_1658.field_2) {
    operator_delete(local_1658._M_dataplus._M_p,local_1658.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_17d0.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_cond._M_dataplus._M_p != &local_748.m_cond.field_2) {
    operator_delete(local_748.m_cond._M_dataplus._M_p,
                    local_748.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_description._M_dataplus._M_p != &local_748.m_description.field_2) {
    operator_delete(local_748.m_description._M_dataplus._M_p,
                    local_748.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_748.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_key_name._M_dataplus._M_p != &local_748.m_key_name.field_2) {
    operator_delete(local_748.m_key_name._M_dataplus._M_p,
                    local_748.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_17e8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_18a0);
  lVar15 = 0x220;
  do {
    if ((long *)((long)local_b68 + lVar15) != *(long **)((long)local_b78 + lVar15)) {
      operator_delete(*(long **)((long)local_b78 + lVar15),*(long *)((long)local_b68 + lVar15) + 1);
    }
    if ((long *)((long)local_b88 + lVar15) != *(long **)((long)local_b98 + lVar15)) {
      operator_delete(*(long **)((long)local_b98 + lVar15),*(long *)((long)local_b88 + lVar15) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)(local_c20 + lVar15 + 0x68));
    if ((long *)(local_c20 + lVar15 + 0x58) != *(long **)(local_c20 + lVar15 + 0x48)) {
      operator_delete(*(long **)(local_c20 + lVar15 + 0x48),*(long *)(local_c20 + lVar15 + 0x58) + 1
                     );
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1558.m_cond._M_dataplus._M_p != &local_1558.m_cond.field_2) {
    operator_delete(local_1558.m_cond._M_dataplus._M_p,
                    local_1558.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1558.m_description._M_dataplus._M_p != &local_1558.m_description.field_2) {
    operator_delete(local_1558.m_description._M_dataplus._M_p,
                    local_1558.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1558.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1558.m_key_name._M_dataplus._M_p != &local_1558.m_key_name.field_2) {
    operator_delete(local_1558.m_key_name._M_dataplus._M_p,
                    local_1558.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe5b8);
  if (local_1598[0] != local_1588) {
    operator_delete(local_1598[0],local_1588[0] + 1);
  }
  if (local_1578[0] != local_1568) {
    operator_delete(local_1578[0],local_1568[0] + 1);
  }
  if (local_14d0[0] != local_14c0) {
    operator_delete(local_14d0[0],local_14c0[0] + 1);
  }
  if (local_14b0[0] != local_14a0) {
    operator_delete(local_14b0[0],local_14a0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe5e8);
  if (local_1490[0] != local_1480) {
    operator_delete(local_1490[0],local_1480[0] + 1);
  }
  if (local_1470[0] != local_1460) {
    operator_delete(local_1470[0],local_1460[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_18b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c20._104_8_ != &local_ba8) {
    operator_delete((void *)local_c20._104_8_,local_ba8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_c20._72_8_ != local_c20 + 0x58) {
    operator_delete((void *)local_c20._72_8_,local_c20._88_8_ + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)(local_c20 + 0x28));
  if ((undefined1 *)local_c20._8_8_ != local_c20 + 0x18) {
    operator_delete((void *)local_c20._8_8_,local_c20._24_8_ + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_18d0);
  lVar15 = 0x4c8;
  do {
    if ((long *)(local_1138 + lVar15) != *(long **)((long)local_1148 + lVar15)) {
      operator_delete(*(long **)((long)local_1148 + lVar15),*(long *)(local_1138 + lVar15) + 1);
    }
    if ((long *)((long)local_1158 + lVar15) != *(long **)((long)local_1168 + lVar15)) {
      operator_delete(*(long **)((long)local_1168 + lVar15),*(long *)((long)local_1158 + lVar15) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar15));
    if ((long *)((long)local_1198 + lVar15) != *(long **)((long)local_11a8 + lVar15)) {
      operator_delete(*(long **)((long)local_11a8 + lVar15),*(long *)((long)local_1198 + lVar15) + 1
                     );
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe620);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1410.m_cond._M_dataplus._M_p != &local_1410.m_cond.field_2) {
    operator_delete(local_1410.m_cond._M_dataplus._M_p,
                    local_1410.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1410.m_description._M_dataplus._M_p != &local_1410.m_description.field_2) {
    operator_delete(local_1410.m_description._M_dataplus._M_p,
                    local_1410.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1410.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1410.m_key_name._M_dataplus._M_p != &local_1410.m_key_name.field_2) {
    operator_delete(local_1410.m_key_name._M_dataplus._M_p,
                    local_1410.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe608);
  if (local_1450[0] != local_1440) {
    operator_delete(local_1450[0],local_1440[0] + 1);
  }
  if (local_1430[0] != local_1420) {
    operator_delete(local_1430[0],local_1420[0] + 1);
  }
  if (local_1388[0] != local_1378) {
    operator_delete(local_1388[0],local_1378[0] + 1);
  }
  if (local_1368[0] != local_1358) {
    operator_delete(local_1368[0],local_1358[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe638);
  if (local_1348[0] != local_1338) {
    operator_delete(local_1348[0],local_1338[0] + 1);
  }
  if (local_1328[0] != local_1318) {
    operator_delete(local_1328[0],local_1318[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_19a8);
  if (local_12e8 != &local_12d8) {
    operator_delete(local_12e8,local_12d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1308._M_dataplus._M_p != &local_1308.field_2) {
    operator_delete(local_1308._M_dataplus._M_p,local_1308.field_2._M_allocated_capacity + 1);
  }
  if (local_12c8[0] != local_12b8) {
    operator_delete(local_12c8[0],local_12b8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1988);
  if (local_12a8[0] != local_1298) {
    operator_delete(local_12a8[0],local_1298[0] + 1);
  }
  if (local_1288[0] != local_1278) {
    operator_delete(local_1288[0],local_1278[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1968);
  if (local_1268[0] != local_1258) {
    operator_delete(local_1268[0],local_1258[0] + 1);
  }
  if (local_1248[0] != local_1238) {
    operator_delete(local_1248[0],local_1238[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1948);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1228._M_dataplus._M_p != &local_1228.field_2) {
    operator_delete(local_1228._M_dataplus._M_p,local_1228.field_2._M_allocated_capacity + 1);
  }
  if (local_1208[0] != local_11f8) {
    operator_delete(local_1208[0],local_11f8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1928);
  if (local_11e8[0] != local_11d8) {
    operator_delete(local_11e8[0],local_11d8[0] + 1);
  }
  if (local_11c8[0] != local_11b8) {
    operator_delete(local_11c8[0],local_11b8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1908);
  if (local_11a8[0] != local_1198) {
    operator_delete(local_11a8[0],local_1198[0] + 1);
  }
  if (local_1188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1188.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_18e8);
  if (local_1168[0] != local_1158) {
    operator_delete(local_1168[0],local_1158[0] + 1);
  }
  if (local_1148[0] != (pointer)local_1138) {
    operator_delete(local_1148[0],local_1138._0_8_ + 1);
  }
  if (local_c60[0] != local_c50) {
    operator_delete(local_c60[0],local_c50[0] + 1);
  }
  if (local_c40[0] != local_c30) {
    operator_delete(local_c40[0],local_c30[0] + 1);
  }
  if (local_b98[0] != local_b88) {
    operator_delete(local_b98[0],local_b88[0] + 1);
  }
  if (local_b78[0] != local_b68) {
    operator_delete(local_b78[0],local_b68[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1808);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1888);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1828);
  lVar15 = 0x110;
  do {
    if ((long *)(local_8a8 + lVar15) != *(long **)((long)local_8b8 + lVar15)) {
      operator_delete(*(long **)((long)local_8b8 + lVar15),*(long *)(local_8a8 + lVar15) + 1);
    }
    plVar13 = (long *)((long)local_8b8 + lVar15 + -0x10);
    plVar4 = *(long **)((long)&local_8d8._M_dataplus._M_p + lVar15);
    if (plVar13 != plVar4) {
      operator_delete(plVar4,*plVar13 + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_8f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar15));
    if ((long *)((long)local_908 + lVar15) != *(long **)((long)&local_918 + lVar15)) {
      operator_delete(*(long **)((long)&local_918 + lVar15),*(long *)((long)local_908 + lVar15) + 1)
      ;
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1868);
  if (local_918 != local_908) {
    operator_delete(local_918,local_908[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_938._M_dataplus._M_p != &local_938.field_2) {
    operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
  }
  if (local_8f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_8f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_8f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_8f8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1848);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
  }
  if (local_8b8[0] != (pointer)local_8a8) {
    operator_delete(local_8b8[0],local_8a8._0_8_ + 1);
  }
  if (local_788[0] != local_778) {
    operator_delete(local_788[0],local_778[0] + 1);
  }
  if (local_768[0] != local_758) {
    operator_delete(local_768[0],local_758[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_17b0);
  lVar15 = 0x318;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_3b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar15));
    plVar4 = *(long **)((long)&local_410 + lVar15 + 0x40);
    plVar13 = (long *)((long)&local_410 + lVar15 + 0x50);
    if (plVar13 != plVar4) {
      operator_delete(plVar4,*plVar13 + 1);
    }
    plVar13 = (long *)((long)&local_410 + lVar15 + 0x28);
    plVar4 = *(long **)((long)&local_410 + lVar15 + 0x18);
    if (plVar13 != plVar4) {
      operator_delete(plVar4,*plVar13 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_458 + lVar15));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl +
               lVar15));
    if ((long *)((long)local_488 + lVar15) != *(long **)((long)local_498 + lVar15)) {
      operator_delete(*(long **)((long)local_498 + lVar15),*(long *)((long)local_488 + lVar15) + 1);
    }
    lVar15 = lVar15 + -0x108;
  } while (lVar15 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_698);
  if (local_6b8 != &local_6a8) {
    operator_delete(local_6b8,CONCAT71(uStack_6a7,local_6a8) + 1);
  }
  if (local_678[0] != local_668) {
    operator_delete(local_678[0],local_668[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_600._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_658.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_658.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.val._M_dataplus._M_p != &local_658.val.field_2) {
    operator_delete(local_658.val._M_dataplus._M_p,
                    CONCAT71(local_658.val.field_2._M_allocated_capacity._1_7_,
                             local_658.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_5a0[0] != local_590) {
    operator_delete(local_5a0[0],local_590[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_558);
  if (local_578 != &local_568) {
    operator_delete(local_578,CONCAT71(uStack_567,local_568) + 1);
  }
  if (local_538[0] != local_528) {
    operator_delete(local_538[0],local_528[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_4f8._M_first);
  if (local_518 != &local_508) {
    operator_delete(local_518,CONCAT44(uStack_504,local_508) + 1);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_450);
  if (local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_430[0] != local_420) {
    operator_delete(local_430[0],local_420[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_410._M_first);
  if (local_3b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_3b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_3b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_3b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan gettransaction()
{
    return RPCHelpMan{"gettransaction",
                "\nGet detailed information about in-wallet transaction <txid>\n",
                {
                    {"txid", RPCArg::Type::STR, RPCArg::Optional::NO, "The transaction id"},
                    {"include_watchonly", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"},
                            "Whether to include watch-only addresses in balance calculation and details[]"},
                    {"verbose", RPCArg::Type::BOOL, RPCArg::Default{false},
                            "Whether to include a `decoded` field containing the decoded transaction (equivalent to RPC decoderawtransaction)"},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "", Cat(Cat<std::vector<RPCResult>>(
                    {
                        {RPCResult::Type::STR_AMOUNT, "amount", "The amount in " + CURRENCY_UNIT},
                        {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The amount of the fee in " + CURRENCY_UNIT + ". This is negative and only available for the\n"
                                     "'send' category of transactions."},
                    },
                    TransactionDescriptionString()),
                    {
                        {RPCResult::Type::ARR, "details", "",
                        {
                            {RPCResult::Type::OBJ, "", "",
                            {
                                {RPCResult::Type::BOOL, "involvesWatchonly", /*optional=*/true, "Only returns true if imported addresses were involved in transaction."},
                                {RPCResult::Type::STR, "address", /*optional=*/true, "The bitcoin address involved in the transaction."},
                                {RPCResult::Type::STR, "category", "The transaction category.\n"
                                    "\"send\"                  Transactions sent.\n"
                                    "\"receive\"               Non-coinbase transactions received.\n"
                                    "\"generate\"              Coinbase transactions received with more than 100 confirmations.\n"
                                    "\"immature\"              Coinbase transactions received with 100 or fewer confirmations.\n"
                                    "\"orphan\"                Orphaned coinbase transactions received."},
                                {RPCResult::Type::STR_AMOUNT, "amount", "The amount in " + CURRENCY_UNIT},
                                {RPCResult::Type::STR, "label", /*optional=*/true, "A comment for the address/transaction, if any"},
                                {RPCResult::Type::NUM, "vout", "the vout value"},
                                {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The amount of the fee in " + CURRENCY_UNIT + ". This is negative and only available for the \n"
                                    "'send' category of transactions."},
                                {RPCResult::Type::BOOL, "abandoned", "'true' if the transaction has been abandoned (inputs are respendable)."},
                                {RPCResult::Type::ARR, "parent_descs", /*optional=*/true, "Only if 'category' is 'received'. List of parent descriptors for the output script of this coin.", {
                                    {RPCResult::Type::STR, "desc", "The descriptor string."},
                                }},
                            }},
                        }},
                        {RPCResult::Type::STR_HEX, "hex", "Raw data for transaction"},
                        {RPCResult::Type::OBJ, "decoded", /*optional=*/true, "The decoded transaction (only present when `verbose` is passed)",
                        {
                            {RPCResult::Type::ELISION, "", "Equivalent to the RPC decoderawtransaction method, or the RPC getrawtransaction method when `verbose` is passed."},
                        }},
                        RESULT_LAST_PROCESSED_BLOCK,
                    })
                },
                RPCExamples{
                    HelpExampleCli("gettransaction", "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\"")
            + HelpExampleCli("gettransaction", "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\" true")
            + HelpExampleCli("gettransaction", "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\" false true")
            + HelpExampleRpc("gettransaction", "\"1075db55d416d3ca199f55b6084e2115b9345e16c5cf302fc80e9d5fbf5d48d\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    uint256 hash(ParseHashV(request.params[0], "txid"));

    isminefilter filter = ISMINE_SPENDABLE;

    if (ParseIncludeWatchonly(request.params[1], *pwallet)) {
        filter |= ISMINE_WATCH_ONLY;
    }

    bool verbose = request.params[2].isNull() ? false : request.params[2].get_bool();

    UniValue entry(UniValue::VOBJ);
    auto it = pwallet->mapWallet.find(hash);
    if (it == pwallet->mapWallet.end()) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid or non-wallet transaction id");
    }
    const CWalletTx& wtx = it->second;

    CAmount nCredit = CachedTxGetCredit(*pwallet, wtx, filter);
    CAmount nDebit = CachedTxGetDebit(*pwallet, wtx, filter);
    CAmount nNet = nCredit - nDebit;
    CAmount nFee = (CachedTxIsFromMe(*pwallet, wtx, filter) ? wtx.tx->GetValueOut() - nDebit : 0);

    entry.pushKV("amount", ValueFromAmount(nNet - nFee));
    if (CachedTxIsFromMe(*pwallet, wtx, filter))
        entry.pushKV("fee", ValueFromAmount(nFee));

    WalletTxToJSON(*pwallet, wtx, entry);

    UniValue details(UniValue::VARR);
    ListTransactions(*pwallet, wtx, 0, false, details, filter, /*filter_label=*/std::nullopt);
    entry.pushKV("details", std::move(details));

    entry.pushKV("hex", EncodeHexTx(*wtx.tx));

    if (verbose) {
        UniValue decoded(UniValue::VOBJ);
        TxToUniv(*wtx.tx, /*block_hash=*/uint256(), /*entry=*/decoded, /*include_hex=*/false);
        entry.pushKV("decoded", std::move(decoded));
    }

    AppendLastProcessedBlock(entry, *pwallet);
    return entry;
},
    };
}